

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-mip-test.h
# Opt level: O2

void __thiscall mip_converter_test::MIPInstance::SparseVec::~SparseVec(SparseVec *this)

{
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->v_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)this);
  return;
}

Assistant:

SparseVec(const std::vector<double>& c, const std::vector<int>& v) :
      c_(c), v_(v) { }